

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  value_type pLVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  reference ppLVar5;
  Allocator *_allocator;
  long in_RDI;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  Mat weight_data_int8_scales;
  Mat bottom_blob_int8_scales;
  InnerProduct *fc;
  iterator iter;
  char key [256];
  iterator iter_data;
  int i;
  int layer_count;
  Mat *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  FILE *__stream;
  Mat *in_stack_fffffffffffffcc8;
  Option *in_stack_fffffffffffffd78;
  Mat *in_stack_fffffffffffffd80;
  Mat *in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  _Self local_170 [3];
  allocator local_151;
  string local_150 [32];
  _Self local_130;
  char local_128 [256];
  _Self local_28;
  _Self local_20;
  int local_18;
  int local_14;
  int local_4;
  
  sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_14 = (int)sVar3;
  local_18 = 0;
  do {
    if (local_14 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
               (long)local_18);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                            (char *)in_stack_fffffffffffffc78);
    if (!bVar2) {
      _allocator = (Allocator *)(in_RDI + 0x78);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                 (long)local_18);
      local_20._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   *)in_stack_fffffffffffffc78,(key_type *)0x154a62);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                  *)in_stack_fffffffffffffc78);
      bVar2 = std::operator==(&local_20,&local_28);
      if (!bVar2) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   (long)local_18);
        uVar4 = std::__cxx11::string::c_str();
        sprintf(local_128,"%s_param_0",uVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,local_128,&local_151);
        local_130._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                     *)in_stack_fffffffffffffc78,(key_type *)0x154b2d);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        local_170[0]._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                    *)in_stack_fffffffffffffc78);
        bVar2 = std::operator==(&local_130,local_170);
        if (bVar2) {
          fprintf(_stderr,"this layer need to be quantized, but no scale param!\n");
          return -1;
        }
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),(long)local_18);
        pLVar1 = *ppLVar5;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                      *)0x154c2e);
        ncnn::Mat::Mat((Mat *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc78);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>
                      *)0x154c4f);
        ncnn::Mat::Mat((Mat *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc78);
        __stream = _stderr;
        uVar4 = std::__cxx11::string::c_str();
        fprintf(__stream,"quantize_innerproduct %s\n",uVar4);
        ncnn::Mat::reshape(in_stack_fffffffffffffcc8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           _allocator);
        ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffd60);
        ncnn::quantize_to_int8
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffd78);
        bVar2 = ncnn::Mat::empty((Mat *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80
                                                ));
        in_stack_fffffffffffffc87 = bVar2;
        if (bVar2) {
          local_4 = -100;
        }
        else {
          ncnn::Mat::reshape(in_stack_fffffffffffffcc8,(int)((ulong)in_RDI >> 0x20),_allocator);
          ncnn::Mat::operator=
                    ((Mat *)__stream,
                     (Mat *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          ncnn::Mat::~Mat((Mat *)0x154e4e);
        }
        ncnn::Mat::~Mat((Mat *)0x154e66);
        ncnn::Mat::~Mat((Mat *)0x154e73);
        if (!bVar2) {
          pLVar1[1].support_bf16_storage = true;
          pLVar1[1].support_fp16_storage = false;
          pLVar1[1].support_int8_storage = false;
          pLVar1[1].support_image_storage = false;
          ncnn::Mat::operator=
                    ((Mat *)__stream,
                     (Mat *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          ncnn::Mat::operator=
                    ((Mat *)__stream,
                     (Mat *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          bVar2 = false;
        }
        ncnn::Mat::~Mat((Mat *)0x154ee6);
        ncnn::Mat::~Mat((Mat *)0x154ef3);
        if (bVar2 != false) {
          return local_4;
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}